

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O3

void enet_peer_setup_outgoing_command(ENetPeer *peer,ENetOutgoingCommand *outgoingCommand)

{
  ushort uVar1;
  size_t sVar2;
  byte bVar3;
  ushort uVar4;
  ushort *puVar5;
  
  puVar5 = (ushort *)
           ((long)peer->channels->reliableWindows +
           ((ulong)((uint)(outgoingCommand->command).header.channelID * 0x50) - 6));
  sVar2 = enet_protocol_command_size((outgoingCommand->command).header.command);
  peer->outgoingDataTotal =
       peer->outgoingDataTotal + (int)sVar2 + (uint)outgoingCommand->fragmentLength;
  if ((outgoingCommand->command).header.channelID == 0xff) {
    uVar4 = (short)*(undefined4 *)&peer->outgoingReliableSequenceNumber + 1;
    peer->outgoingReliableSequenceNumber = uVar4;
LAB_0015f1f5:
    uVar1 = 0;
  }
  else {
    bVar3 = (outgoingCommand->command).header.command;
    if ((char)bVar3 < '\0') {
      uVar4 = (short)*(undefined4 *)puVar5 + 1;
      *puVar5 = uVar4;
      puVar5[1] = 0;
      goto LAB_0015f1f5;
    }
    if (0x3f < bVar3) {
      peer->outgoingUnsequencedGroup = peer->outgoingUnsequencedGroup + 1;
      uVar4 = 0;
      goto LAB_0015f1f5;
    }
    uVar1 = puVar5[1];
    if (outgoingCommand->fragmentOffset == 0) {
      uVar1 = uVar1 + 1;
      puVar5[1] = uVar1;
    }
    uVar4 = *puVar5;
  }
  outgoingCommand->reliableSequenceNumber = uVar4;
  outgoingCommand->unreliableSequenceNumber = uVar1;
  outgoingCommand->sendAttempts = 0;
  outgoingCommand->sentTime = 0;
  outgoingCommand->roundTripTimeout = 0;
  outgoingCommand->roundTripTimeoutLimit = 0;
  (outgoingCommand->command).header.reliableSequenceNumber = uVar4 << 8 | uVar4 >> 8;
  bVar3 = (outgoingCommand->command).header.command & 0xf;
  if (bVar3 != 7) {
    if (bVar3 != 9) goto LAB_0015f23d;
    uVar1 = peer->outgoingUnsequencedGroup;
  }
  (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber = uVar1 << 8 | uVar1 >> 8;
LAB_0015f23d:
  enet_list_insert(&(peer->outgoingCommands).sentinel,outgoingCommand);
  return;
}

Assistant:

void
enet_peer_setup_outgoing_command (ENetPeer * peer, ENetOutgoingCommand * outgoingCommand)
{
    ENetChannel * channel = & peer -> channels [outgoingCommand -> command.header.channelID];
    
    peer -> outgoingDataTotal += enet_protocol_command_size (outgoingCommand -> command.header.command) + outgoingCommand -> fragmentLength;

    if (outgoingCommand -> command.header.channelID == 0xFF)
    {
       ++ peer -> outgoingReliableSequenceNumber;

       outgoingCommand -> reliableSequenceNumber = peer -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
    {
       ++ channel -> outgoingReliableSequenceNumber;
       channel -> outgoingUnreliableSequenceNumber = 0;

       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED)
    {
       ++ peer -> outgoingUnsequencedGroup;

       outgoingCommand -> reliableSequenceNumber = 0;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    {
       if (outgoingCommand -> fragmentOffset == 0)
         ++ channel -> outgoingUnreliableSequenceNumber;
        
       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = channel -> outgoingUnreliableSequenceNumber;
    }
   
    outgoingCommand -> sendAttempts = 0;
    outgoingCommand -> sentTime = 0;
    outgoingCommand -> roundTripTimeout = 0;
    outgoingCommand -> roundTripTimeoutLimit = 0;
    outgoingCommand -> command.header.reliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> reliableSequenceNumber);

    switch (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK)
    {
    case ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE:
        outgoingCommand -> command.sendUnreliable.unreliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> unreliableSequenceNumber);
        break;

    case ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED:
        outgoingCommand -> command.sendUnsequenced.unsequencedGroup = ENET_HOST_TO_NET_16 (peer -> outgoingUnsequencedGroup);
        break;
    
    default:
        break;
    }

    enet_list_insert (enet_list_end (& peer -> outgoingCommands), outgoingCommand);
}